

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int denoise_and_model_realloc_if_necessary(aom_denoise_and_model_t *ctx,YV12_BUFFER_CONFIG *sd)

{
  int iVar1;
  aom_noise_model_params_t params_00;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  int *in_RSI;
  int *in_RDI;
  float fVar5;
  float fVar6;
  int i_1;
  float uv_noise_level;
  float y_noise_level;
  aom_noise_model_params_t params;
  int i;
  int block_size;
  int use_highbd;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 uStack_c;
  int local_4;
  
  iVar9 = (int)in_RDI;
  uStack_c = (undefined4)((ulong)in_RDI >> 0x20);
  if ((((in_RDI[3] == *in_RSI) && (in_RDI[4] == in_RSI[2])) && (in_RDI[5] == in_RSI[8])) &&
     (in_RDI[6] == in_RSI[9])) {
    local_4 = 1;
  }
  else {
    uVar2 = (uint)((in_RSI[0x30] & 8U) != 0);
    iVar1 = *in_RDI;
    in_RDI[3] = *in_RSI;
    in_RDI[4] = in_RSI[2];
    in_RDI[5] = in_RSI[8];
    in_RDI[6] = in_RSI[9];
    for (iVar7 = 0; iVar7 < 3; iVar7 = iVar7 + 1) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      *(undefined8 *)(CONCAT44(uStack_c,iVar9) + 0x40 + (long)iVar7 * 8) = 0;
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    *(undefined8 *)(CONCAT44(uStack_c,iVar9) + 0x58) = 0;
    pvVar4 = aom_malloc(0x3bd076);
    *(void **)(CONCAT44(uStack_c,iVar9) + 0x40) = pvVar4;
    pvVar4 = aom_malloc(0x3bd0a1);
    *(void **)(CONCAT44(uStack_c,iVar9) + 0x48) = pvVar4;
    pvVar4 = aom_malloc(0x3bd0cc);
    *(void **)(CONCAT44(uStack_c,iVar9) + 0x50) = pvVar4;
    if (((*(long *)(CONCAT44(uStack_c,iVar9) + 0x40) == 0) ||
        (*(long *)(CONCAT44(uStack_c,iVar9) + 0x48) == 0)) ||
       (*(long *)(CONCAT44(uStack_c,iVar9) + 0x50) == 0)) {
      fprintf(_stderr,"Unable to allocate denoise buffers\n");
      local_4 = 0;
    }
    else {
      *(int *)(CONCAT44(uStack_c,iVar9) + 0x1c) =
           (*in_RSI + *(int *)CONCAT44(uStack_c,iVar9) + -1) / *(int *)CONCAT44(uStack_c,iVar9);
      *(int *)(CONCAT44(uStack_c,iVar9) + 0x20) =
           (in_RSI[2] + *(int *)CONCAT44(uStack_c,iVar9) + -1) / *(int *)CONCAT44(uStack_c,iVar9);
      pvVar4 = aom_malloc(0x3bd181);
      *(void **)(CONCAT44(uStack_c,iVar9) + 0x58) = pvVar4;
      if (*(long *)(CONCAT44(uStack_c,iVar9) + 0x58) == 0) {
        fprintf(_stderr,"Unable to allocate flat_blocks buffer\n");
        local_4 = 0;
      }
      else {
        aom_flat_block_finder_free((aom_flat_block_finder_t *)0x3bd1cc);
        iVar3 = aom_flat_block_finder_init
                          ((aom_flat_block_finder_t *)ctx,sd._4_4_,(int)sd,use_highbd);
        if (iVar3 == 0) {
          fprintf(_stderr,"Unable to init flat block finder\n");
          local_4 = 0;
        }
        else {
          uVar8 = uVar2;
          aom_noise_model_free
                    ((aom_noise_model_t *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          params_00._4_8_ = in_RSI;
          params_00._0_4_ = uVar8;
          params_00.use_highbd = iVar9;
          iVar7 = aom_noise_model_init((aom_noise_model_t *)CONCAT44(iVar7,uVar2),params_00);
          if (iVar7 == 0) {
            fprintf(_stderr,"Unable to init noise model\n");
            local_4 = 0;
          }
          else {
            fVar5 = aom_noise_psd_get_default_value
                              (*(int *)CONCAT44(uStack_c,iVar9),
                               *(float *)(CONCAT44(uStack_c,iVar9) + 8));
            fVar6 = aom_noise_psd_get_default_value
                              (*(int *)CONCAT44(uStack_c,iVar9) >> ((byte)in_RSI[0x24] & 0x1f),
                               *(float *)(CONCAT44(uStack_c,iVar9) + 8));
            for (iVar7 = 0; iVar7 < iVar1 * iVar1; iVar7 = iVar7 + 1) {
              *(float *)(*(long *)(CONCAT44(uStack_c,iVar9) + 0x28) + (long)iVar7 * 4) = fVar5;
              *(float *)(*(long *)(CONCAT44(uStack_c,iVar9) + 0x38) + (long)iVar7 * 4) = fVar6;
              *(float *)(*(long *)(CONCAT44(uStack_c,iVar9) + 0x30) + (long)iVar7 * 4) = fVar6;
            }
            local_4 = 1;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int denoise_and_model_realloc_if_necessary(
    struct aom_denoise_and_model_t *ctx, const YV12_BUFFER_CONFIG *sd) {
  if (ctx->width == sd->y_width && ctx->height == sd->y_height &&
      ctx->y_stride == sd->y_stride && ctx->uv_stride == sd->uv_stride)
    return 1;
  const int use_highbd = (sd->flags & YV12_FLAG_HIGHBITDEPTH) != 0;
  const int block_size = ctx->block_size;

  ctx->width = sd->y_width;
  ctx->height = sd->y_height;
  ctx->y_stride = sd->y_stride;
  ctx->uv_stride = sd->uv_stride;

  for (int i = 0; i < 3; ++i) {
    aom_free(ctx->denoised[i]);
    ctx->denoised[i] = NULL;
  }
  aom_free(ctx->flat_blocks);
  ctx->flat_blocks = NULL;

  ctx->denoised[0] =
      (uint8_t *)aom_malloc((sd->y_stride * sd->y_height) << use_highbd);
  ctx->denoised[1] =
      (uint8_t *)aom_malloc((sd->uv_stride * sd->uv_height) << use_highbd);
  ctx->denoised[2] =
      (uint8_t *)aom_malloc((sd->uv_stride * sd->uv_height) << use_highbd);
  if (!ctx->denoised[0] || !ctx->denoised[1] || !ctx->denoised[2]) {
    fprintf(stderr, "Unable to allocate denoise buffers\n");
    return 0;
  }
  ctx->num_blocks_w = (sd->y_width + ctx->block_size - 1) / ctx->block_size;
  ctx->num_blocks_h = (sd->y_height + ctx->block_size - 1) / ctx->block_size;
  ctx->flat_blocks =
      (uint8_t *)aom_malloc(ctx->num_blocks_w * ctx->num_blocks_h);
  if (!ctx->flat_blocks) {
    fprintf(stderr, "Unable to allocate flat_blocks buffer\n");
    return 0;
  }

  aom_flat_block_finder_free(&ctx->flat_block_finder);
  if (!aom_flat_block_finder_init(&ctx->flat_block_finder, ctx->block_size,
                                  ctx->bit_depth, use_highbd)) {
    fprintf(stderr, "Unable to init flat block finder\n");
    return 0;
  }

  const aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 3,
                                            ctx->bit_depth, use_highbd };
  aom_noise_model_free(&ctx->noise_model);
  if (!aom_noise_model_init(&ctx->noise_model, params)) {
    fprintf(stderr, "Unable to init noise model\n");
    return 0;
  }

  // Simply use a flat PSD (although we could use the flat blocks to estimate
  // PSD) those to estimate an actual noise PSD)
  const float y_noise_level =
      aom_noise_psd_get_default_value(ctx->block_size, ctx->noise_level);
  const float uv_noise_level = aom_noise_psd_get_default_value(
      ctx->block_size >> sd->subsampling_x, ctx->noise_level);
  for (int i = 0; i < block_size * block_size; ++i) {
    ctx->noise_psd[0][i] = y_noise_level;
    ctx->noise_psd[1][i] = ctx->noise_psd[2][i] = uv_noise_level;
  }
  return 1;
}